

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

uint32_t copysample(aec_stream_conflict *strm)

{
  ulong uVar1;
  internal_state_conflict *piVar2;
  uint *puVar3;
  char cVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  internal_state_conflict *state;
  
  uVar5 = bits_ask(strm,strm->bits_per_sample);
  uVar6 = 0;
  if (uVar5 != 0) {
    uVar1 = strm->avail_out;
    piVar2 = strm->state;
    if (piVar2->bytes_per_sample <= uVar1) {
      cVar4 = (char)strm->bits_per_sample;
      puVar3 = piVar2->rsip;
      piVar2->rsip = puVar3 + 1;
      *puVar3 = (uint)(piVar2->acc >> ((char)piVar2->bitp - cVar4 & 0x3fU)) &
                (uint)(0xffffffffffffffff >> (-cVar4 & 0x3fU));
      strm->avail_out = uVar1 - piVar2->bytes_per_sample;
      piVar2->bitp = piVar2->bitp - strm->bits_per_sample;
      uVar6 = 1;
    }
  }
  return uVar6;
}

Assistant:

static inline uint32_t copysample(struct aec_stream *strm)
{
    if (bits_ask(strm, strm->bits_per_sample) == 0
        || strm->avail_out < strm->state->bytes_per_sample)
        return 0;

    put_sample(strm, bits_get(strm, strm->bits_per_sample));
    bits_drop(strm, strm->bits_per_sample);
    return 1;
}